

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O1

cm_message_output cm_get_output(void)

{
  int iVar1;
  char *__s1;
  cm_message_output cVar2;
  
  cVar2 = global_msg_output;
  __s1 = getenv("CMOCKA_MESSAGE_OUTPUT");
  if (__s1 != (char *)0x0) {
    iVar1 = strcasecmp(__s1,"STDOUT");
    if (iVar1 == 0) {
      cVar2 = CM_OUTPUT_STDOUT;
    }
    else {
      iVar1 = strcasecmp(__s1,"SUBUNIT");
      if (iVar1 == 0) {
        cVar2 = CM_OUTPUT_SUBUNIT;
      }
      else {
        iVar1 = strcasecmp(__s1,"TAP");
        if (iVar1 == 0) {
          cVar2 = CM_OUTPUT_TAP;
        }
        else {
          iVar1 = strcasecmp(__s1,"XML");
          if (iVar1 == 0) {
            cVar2 = CM_OUTPUT_XML;
          }
        }
      }
    }
  }
  return cVar2;
}

Assistant:

static enum cm_message_output cm_get_output(void)
{
    enum cm_message_output output = global_msg_output;
    char *env;

    env = getenv("CMOCKA_MESSAGE_OUTPUT");
    if (env != NULL) {
        if (strcasecmp(env, "STDOUT") == 0) {
            output = CM_OUTPUT_STDOUT;
        } else if (strcasecmp(env, "SUBUNIT") == 0) {
            output = CM_OUTPUT_SUBUNIT;
        } else if (strcasecmp(env, "TAP") == 0) {
            output = CM_OUTPUT_TAP;
        } else if (strcasecmp(env, "XML") == 0) {
            output = CM_OUTPUT_XML;
        }
    }

    return output;
}